

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  bool bVar2;
  stbi_uc sVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  stbi_uc *psVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  stbi_uc sVar13;
  char *pcVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  float *output;
  int iVar20;
  stbi_uc *psVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char cStack_4c8;
  char cStack_4c7;
  char cStack_4c6;
  char cStack_4c5;
  char cStack_4c4;
  char cStack_4c3;
  char cStack_4c2;
  char cStack_4c1;
  char buffer [1024];
  stbi_uc local_c0 [4];
  stbi_uc local_bc;
  stbi_uc local_bb;
  byte local_ba;
  stbi_uc local_b9;
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  float *local_70;
  char *local_68;
  ulong local_60;
  float *local_58;
  stbi_uc *local_50;
  int local_44;
  stbi_uc *local_40;
  int local_34;
  
  local_34 = req_comp;
  stbi__hdr_gettoken(s,&cStack_4c8);
  if (CONCAT17(buffer[2],
               CONCAT16(buffer[1],
                        CONCAT15(buffer[0],
                                 CONCAT14(cStack_4c1,
                                          CONCAT13(cStack_4c2,
                                                   CONCAT12(cStack_4c3,
                                                            CONCAT11(cStack_4c4,cStack_4c5))))))) ==
      0x45434e41494441 &&
      CONCAT17(cStack_4c1,
               CONCAT16(cStack_4c2,
                        CONCAT15(cStack_4c3,
                                 CONCAT14(cStack_4c4,
                                          CONCAT13(cStack_4c5,
                                                   CONCAT12(cStack_4c6,
                                                            CONCAT11(cStack_4c7,cStack_4c8))))))) ==
      0x4e41494441523f23) {
    local_40 = (stbi_uc *)comp;
    stbi__hdr_gettoken(s,&cStack_4c8);
    if (cStack_4c8 != '\0') {
      bVar2 = false;
      do {
        auVar23[0] = -(cStack_4c1 == '3');
        auVar23[1] = -(buffer[0] == '2');
        auVar23[2] = -(buffer[1] == '-');
        auVar23[3] = -(buffer[2] == 'b');
        auVar23[4] = -(buffer[3] == 'i');
        auVar23[5] = -(buffer[4] == 't');
        auVar23[6] = -(buffer[5] == '_');
        auVar23[7] = -(buffer[6] == 'r');
        auVar23[8] = -(buffer[7] == 'l');
        auVar23[9] = -(buffer[8] == 'e');
        auVar23[10] = -(buffer[9] == '_');
        auVar23[0xb] = -(buffer[10] == 'r');
        auVar23[0xc] = -(buffer[0xb] == 'g');
        auVar23[0xd] = -(buffer[0xc] == 'b');
        auVar23[0xe] = -(buffer[0xd] == 'e');
        auVar23[0xf] = -(buffer[0xe] == '\0');
        auVar24[0] = -(cStack_4c8 == 'F');
        auVar24[1] = -(cStack_4c7 == 'O');
        auVar24[2] = -(cStack_4c6 == 'R');
        auVar24[3] = -(cStack_4c5 == 'M');
        auVar24[4] = -(cStack_4c4 == 'A');
        auVar24[5] = -(cStack_4c3 == 'T');
        auVar24[6] = -(cStack_4c2 == '=');
        auVar24[7] = -(cStack_4c1 == '3');
        auVar24[8] = -(buffer[0] == '2');
        auVar24[9] = -(buffer[1] == '-');
        auVar24[10] = -(buffer[2] == 'b');
        auVar24[0xb] = -(buffer[3] == 'i');
        auVar24[0xc] = -(buffer[4] == 't');
        auVar24[0xd] = -(buffer[5] == '_');
        auVar24[0xe] = -(buffer[6] == 'r');
        auVar24[0xf] = -(buffer[7] == 'l');
        auVar24 = auVar24 & auVar23;
        if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
          bVar2 = true;
        }
        stbi__hdr_gettoken(s,&cStack_4c8);
      } while (cStack_4c8 != '\0');
      if (bVar2) {
        local_68 = &cStack_4c8;
        stbi__hdr_gettoken(s,&cStack_4c8);
        if (cStack_4c6 == ' ' && CONCAT11(cStack_4c7,cStack_4c8) == 0x592d) {
          local_68 = &cStack_4c5;
          uVar6 = strtol(local_68,&local_68,10);
          local_68 = local_68 + -1;
          do {
            pcVar14 = local_68;
            local_68 = pcVar14 + 1;
          } while (pcVar14[1] == ' ');
          iVar4 = strncmp(local_68,"+X ",3);
          if (iVar4 == 0) {
            local_68 = pcVar14 + 4;
            iVar20 = 0;
            local_60 = strtol(local_68,(char **)0x0,10);
            iVar4 = (int)local_60;
            *x = iVar4;
            iVar17 = (int)uVar6;
            *y = iVar17;
            if (local_40 != (stbi_uc *)0x0) {
              local_40[0] = '\x03';
              local_40[1] = '\0';
              local_40[2] = '\0';
              local_40[3] = '\0';
            }
            local_44 = 3;
            if (local_34 != 0) {
              local_44 = local_34;
            }
            local_70 = (float *)malloc((long)(local_44 * iVar17 * iVar4) << 2);
            local_58 = local_70;
            if (iVar4 - 0x8000U < 0xffff8008) goto LAB_0011e68d;
            if (iVar17 < 1) {
              local_50 = (stbi_uc *)0x0;
            }
            else {
              psVar1 = s->buffer_start;
              local_40 = s->buffer_start + 1;
              iVar4 = (int)local_60;
              lVar10 = (long)local_44;
              uVar11 = local_60 & 0xffffffff;
              uVar9 = local_60 & 0x7fffffff;
              uVar22 = 0;
              local_50 = (stbi_uc *)0x0;
              do {
                psVar21 = s->img_buffer;
                if (psVar21 < s->img_buffer_end) {
LAB_0011e201:
                  s->img_buffer = psVar21 + 1;
                  sVar3 = *psVar21;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar20 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = local_40;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar20;
                    }
                    psVar21 = s->img_buffer;
                    goto LAB_0011e201;
                  }
                  sVar3 = '\0';
                }
                psVar21 = s->img_buffer;
                if (psVar21 < s->img_buffer_end) {
LAB_0011e274:
                  s->img_buffer = psVar21 + 1;
                  sVar13 = *psVar21;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar20 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = local_40;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar20;
                    }
                    psVar21 = s->img_buffer;
                    goto LAB_0011e274;
                  }
                  sVar13 = '\0';
                }
                pbVar7 = s->img_buffer;
                if (pbVar7 < s->img_buffer_end) {
LAB_0011e2e7:
                  s->img_buffer = pbVar7 + 1;
                  bVar16 = *pbVar7;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar20 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = local_40;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar20;
                    }
                    pbVar7 = s->img_buffer;
                    goto LAB_0011e2e7;
                  }
                  bVar16 = 0;
                }
                if (((sVar3 != '\x02') || (sVar13 != '\x02')) || ((char)bVar16 < '\0')) {
                  local_bc = sVar3;
                  local_bb = sVar13;
                  local_ba = bVar16;
                  local_b9 = stbi__get8(s);
                  stbi__hdr_convert(local_58,&local_bc,local_44);
                  free(local_50);
                  iVar20 = 0;
                  iVar4 = 1;
                  do {
                    stbi__getn(s,local_c0,4);
                    uVar6 = local_60;
                    stbi__hdr_convert(local_58 +
                                      (long)(local_44 * (int)local_60 * iVar20) +
                                      (long)(iVar4 * local_44),local_c0,local_44);
                    iVar4 = iVar4 + 1;
                    while ((int)uVar6 <= iVar4) {
                      iVar20 = iVar20 + 1;
LAB_0011e68d:
                      iVar4 = 0;
                      uVar6 = local_60;
                      if (iVar17 <= iVar20) {
                        return local_58;
                      }
                    }
                  } while( true );
                }
                pbVar7 = s->img_buffer;
                if (pbVar7 < s->img_buffer_end) {
LAB_0011e376:
                  s->img_buffer = pbVar7 + 1;
                  uVar5 = (uint)*pbVar7;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar20 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = local_40;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar20;
                    }
                    pbVar7 = s->img_buffer;
                    goto LAB_0011e376;
                  }
                  uVar5 = 0;
                }
                uVar19 = local_60;
                if (((uint)bVar16 << 8 | uVar5) != (uint)local_60) {
                  free(local_58);
                  free(local_50);
                  stbi__g_failure_reason = "invalid decoded scanline length";
                  return (float *)0x0;
                }
                if (local_50 == (stbi_uc *)0x0) {
                  local_50 = (stbi_uc *)malloc((ulong)(uint)(iVar4 * 4));
                }
                lVar12 = 0;
                psVar21 = local_50;
                do {
                  _rgbe_1 = lVar12;
                  if (0 < (int)uVar19) {
                    iVar20 = 0;
                    do {
                      pbVar7 = s->img_buffer;
                      local_34 = iVar20;
                      if (pbVar7 < s->img_buffer_end) {
LAB_0011e433:
                        s->img_buffer = pbVar7 + 1;
                        uVar5 = (uint)*pbVar7;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar20 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar1;
                            s->img_buffer_end = local_40;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar1 + iVar20;
                          }
                          pbVar7 = s->img_buffer;
                          goto LAB_0011e433;
                        }
                        uVar5 = 0;
                      }
                      if ((byte)uVar5 < 0x81) {
                        iVar20 = local_34;
                        if ((byte)uVar5 != 0) {
                          lVar12 = (long)local_34;
                          lVar18 = 0;
                          do {
                            psVar8 = s->img_buffer;
                            if (psVar8 < s->img_buffer_end) {
LAB_0011e50f:
                              s->img_buffer = psVar8 + 1;
                              sVar3 = *psVar8;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                                if (iVar20 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = local_40;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar1 + iVar20;
                                }
                                psVar8 = s->img_buffer;
                                goto LAB_0011e50f;
                              }
                              sVar3 = '\0';
                            }
                            psVar21[lVar18 * 4 + lVar12 * 4] = sVar3;
                            lVar18 = lVar18 + 1;
                          } while (uVar5 != (uint)lVar18);
                          uVar19 = local_60;
                          iVar20 = local_34 + (uint)lVar18;
                        }
                      }
                      else {
                        psVar8 = s->img_buffer;
                        if (psVar8 < s->img_buffer_end) {
LAB_0011e560:
                          s->img_buffer = psVar8 + 1;
                          sVar3 = *psVar8;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar20 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar1;
                              s->img_buffer_end = local_40;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar1 + iVar20;
                            }
                            psVar8 = s->img_buffer;
                            goto LAB_0011e560;
                          }
                          sVar3 = '\0';
                        }
                        iVar20 = local_34;
                        if ((uVar5 & 0x7f) != 0) {
                          lVar12 = 0;
                          do {
                            psVar21[lVar12 * 4 + (long)local_34 * 4] = sVar3;
                            lVar12 = lVar12 + 1;
                          } while ((uVar5 & 0x7f) != (uint)lVar12);
                          iVar20 = local_34 + (uint)lVar12;
                        }
                      }
                    } while (iVar20 < (int)uVar19);
                  }
                  lVar12 = _rgbe_1 + 1;
                  psVar21 = psVar21 + 1;
                } while (lVar12 != 4);
                uVar15 = uVar9;
                output = local_70;
                psVar21 = local_50;
                if (0 < (int)uVar19) {
                  do {
                    stbi__hdr_convert(output,psVar21,local_44);
                    output = output + lVar10;
                    psVar21 = psVar21 + 4;
                    uVar15 = uVar15 - 1;
                  } while (uVar15 != 0);
                }
                uVar22 = uVar22 + 1;
                local_70 = local_70 + uVar11 * lVar10;
              } while (uVar22 != (uVar6 & 0x7fffffff));
            }
            free(local_50);
            return local_58;
          }
        }
        stbi__g_failure_reason = "unsupported data layout";
        return (float *)0x0;
      }
    }
    stbi__g_failure_reason = "unsupported format";
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;


   // Check identifier
   if (strcmp(stbi__hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   // Read data
   hdr_data = (float *) stbi__malloc(height * width * req_comp * sizeof(float));

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) stbi__malloc(width * 4);

         for (k = 0; k < 4; ++k) {
            i = 0;
            while (i < width) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      STBI_FREE(scanline);
   }

   return hdr_data;
}